

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack31_24(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0x7fffffff;
  out[1] = uVar1 >> 0x1f;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x1f | (uVar2 & 0x3fffffff) << 1;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x1e;
  out[2] = uVar2 >> 0x1e | (uVar1 & 0x1fffffff) << 2;
  out[3] = uVar1 >> 0x1d;
  uVar2 = in[3];
  out[3] = uVar1 >> 0x1d | (uVar2 & 0xfffffff) << 3;
  out[4] = uVar2 >> 0x1c;
  uVar1 = in[4];
  out[4] = uVar2 >> 0x1c | (uVar1 & 0x7ffffff) << 4;
  uVar2 = in[5];
  out[5] = uVar1 >> 0x1b;
  out[5] = uVar1 >> 0x1b | (uVar2 & 0x3ffffff) << 5;
  out[6] = uVar2 >> 0x1a;
  uVar1 = in[6];
  out[6] = uVar2 >> 0x1a | (uVar1 & 0x1ffffff) << 6;
  out[7] = uVar1 >> 0x19;
  uVar2 = in[7];
  out[7] = uVar1 >> 0x19 | (uVar2 & 0xffffff) << 7;
  uVar1 = in[8];
  out[8] = uVar2 >> 0x18;
  out[8] = uVar2 >> 0x18 | (uVar1 & 0x7fffff) << 8;
  out[9] = uVar1 >> 0x17;
  uVar2 = in[9];
  out[9] = uVar1 >> 0x17 | (uVar2 & 0x3fffff) << 9;
  out[10] = uVar2 >> 0x16;
  uVar1 = in[10];
  out[10] = uVar2 >> 0x16 | (uVar1 & 0x1fffff) << 10;
  uVar2 = in[0xb];
  out[0xb] = uVar1 >> 0x15;
  out[0xb] = uVar1 >> 0x15 | (uVar2 & 0xfffff) << 0xb;
  out[0xc] = uVar2 >> 0x14;
  uVar1 = in[0xc];
  out[0xc] = uVar2 >> 0x14 | (uVar1 & 0x7ffff) << 0xc;
  out[0xd] = uVar1 >> 0x13;
  uVar2 = in[0xd];
  out[0xd] = uVar1 >> 0x13 | (uVar2 & 0x3ffff) << 0xd;
  uVar1 = in[0xe];
  out[0xe] = uVar2 >> 0x12;
  out[0xe] = uVar2 >> 0x12 | (uVar1 & 0x1ffff) << 0xe;
  out[0xf] = uVar1 >> 0x11;
  uVar2 = in[0xf];
  out[0xf] = uVar1 >> 0x11 | (uVar2 & 0xffff) << 0xf;
  out[0x10] = uVar2 >> 0x10;
  uVar1 = in[0x10];
  out[0x10] = uVar2 >> 0x10 | (uVar1 & 0x7fff) << 0x10;
  uVar2 = in[0x11];
  out[0x11] = uVar1 >> 0xf;
  out[0x11] = uVar1 >> 0xf | (uVar2 & 0x3fff) << 0x11;
  out[0x12] = uVar2 >> 0xe;
  uVar1 = in[0x12];
  out[0x12] = uVar2 >> 0xe | (uVar1 & 0x1fff) << 0x12;
  out[0x13] = uVar1 >> 0xd;
  uVar2 = in[0x13];
  out[0x13] = uVar1 >> 0xd | (uVar2 & 0xfff) << 0x13;
  uVar1 = in[0x14];
  out[0x14] = uVar2 >> 0xc;
  out[0x14] = uVar2 >> 0xc | (uVar1 & 0x7ff) << 0x14;
  out[0x15] = uVar1 >> 0xb;
  uVar2 = in[0x15];
  out[0x15] = uVar1 >> 0xb | (uVar2 & 0x3ff) << 0x15;
  out[0x16] = uVar2 >> 10;
  uVar1 = in[0x16];
  out[0x16] = uVar2 >> 10 | (uVar1 & 0x1ff) << 0x16;
  uVar2 = in[0x17];
  out[0x17] = uVar1 >> 9;
  out[0x17] = (uVar2 & 0xff) << 0x17 | uVar1 >> 9;
  return in + 0x18;
}

Assistant:

const uint32_t *__fastunpack31_24(const uint32_t *__restrict__ in,
                                  uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 31);
  out++;
  *out = ((*in) >> 31);
  ++in;
  *out |= ((*in) % (1U << 30)) << (31 - 30);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 29)) << (31 - 29);
  out++;
  *out = ((*in) >> 29);
  ++in;
  *out |= ((*in) % (1U << 28)) << (31 - 28);
  out++;
  *out = ((*in) >> 28);
  ++in;
  *out |= ((*in) % (1U << 27)) << (31 - 27);
  out++;
  *out = ((*in) >> 27);
  ++in;
  *out |= ((*in) % (1U << 26)) << (31 - 26);
  out++;
  *out = ((*in) >> 26);
  ++in;
  *out |= ((*in) % (1U << 25)) << (31 - 25);
  out++;
  *out = ((*in) >> 25);
  ++in;
  *out |= ((*in) % (1U << 24)) << (31 - 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 23)) << (31 - 23);
  out++;
  *out = ((*in) >> 23);
  ++in;
  *out |= ((*in) % (1U << 22)) << (31 - 22);
  out++;
  *out = ((*in) >> 22);
  ++in;
  *out |= ((*in) % (1U << 21)) << (31 - 21);
  out++;
  *out = ((*in) >> 21);
  ++in;
  *out |= ((*in) % (1U << 20)) << (31 - 20);
  out++;
  *out = ((*in) >> 20);
  ++in;
  *out |= ((*in) % (1U << 19)) << (31 - 19);
  out++;
  *out = ((*in) >> 19);
  ++in;
  *out |= ((*in) % (1U << 18)) << (31 - 18);
  out++;
  *out = ((*in) >> 18);
  ++in;
  *out |= ((*in) % (1U << 17)) << (31 - 17);
  out++;
  *out = ((*in) >> 17);
  ++in;
  *out |= ((*in) % (1U << 16)) << (31 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 15)) << (31 - 15);
  out++;
  *out = ((*in) >> 15);
  ++in;
  *out |= ((*in) % (1U << 14)) << (31 - 14);
  out++;
  *out = ((*in) >> 14);
  ++in;
  *out |= ((*in) % (1U << 13)) << (31 - 13);
  out++;
  *out = ((*in) >> 13);
  ++in;
  *out |= ((*in) % (1U << 12)) << (31 - 12);
  out++;
  *out = ((*in) >> 12);
  ++in;
  *out |= ((*in) % (1U << 11)) << (31 - 11);
  out++;
  *out = ((*in) >> 11);
  ++in;
  *out |= ((*in) % (1U << 10)) << (31 - 10);
  out++;
  *out = ((*in) >> 10);
  ++in;
  *out |= ((*in) % (1U << 9)) << (31 - 9);
  out++;
  *out = ((*in) >> 9);
  ++in;
  *out |= ((*in) % (1U << 8)) << (31 - 8);
  out++;

  return in + 1;
}